

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  void *pvVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  WeightParamType WVar14;
  long *plVar15;
  uint32_t uVar16;
  size_type *psVar17;
  undefined1 *puVar18;
  Result *_result;
  uint uVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  uint uVar23;
  bool bVar24;
  string err;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint64_t local_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar13 = Result::good(__return_storage_ptr__);
  if (!bVar13) {
    return __return_storage_ptr__;
  }
  pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar13 = Result::good(__return_storage_ptr__);
  if (!bVar13) {
    return __return_storage_ptr__;
  }
  pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  if (this->ndArrayInterpretation == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Batchnorm","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar13 = Result::good(__return_storage_ptr__);
    if (!bVar13) {
      return __return_storage_ptr__;
    }
    pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Batchnorm","");
    validateRankCount(__return_storage_ptr__,layer,&local_98,3,-1,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar13 = Result::good(__return_storage_ptr__);
    if (!bVar13) {
      return __return_storage_ptr__;
    }
    pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
  }
  uVar16 = layer->_oneof_case_[0];
  puVar20 = *(undefined1 **)&layer->layer_;
  puVar18 = puVar20;
  if (uVar16 != 0xa0) {
    puVar18 = Specification::_BatchnormLayerParams_default_instance_;
  }
  puVar21 = (undefined1 *)(((ActivationParams *)puVar18)->NonlinearityType_).parametricsoftplus_;
  if ((ActivationParametricSoftplus *)puVar21 == (ActivationParametricSoftplus *)0x0) {
    puVar21 = Specification::_WeightParams_default_instance_;
  }
  iVar3 = *(int *)&((ActivationParametricSoftplus *)puVar21)->alpha_;
  lVar6 = *(long *)((*(ulong *)&((ActivationParametricSoftplus *)puVar21)->_cached_size_ &
                    0xfffffffffffffffe) + 8);
  uVar19 = (0 < iVar3) + 1;
  if (lVar6 == 0) {
    uVar19 = (uint)(0 < iVar3);
  }
  uVar11 = (uint)(*(long *)(((((ActivationParametricSoftplus *)((long)puVar21 + 0x28))->
                             super_MessageLite)._internal_metadata_.ptr_ & 0xfffffffffffffffeU) + 8)
                 == 0);
  uVar19 = (uVar19 - (*(long *)(((ulong)(((ActivationParametricSoftplus *)((long)puVar21 + 0x28))->
                                        super_MessageLite)._vptr_MessageLite & 0xfffffffffffffffe) +
                               8) == 0)) + 2;
  if (((uVar19 - uVar11 < 2) &&
      ((uVar19 == uVar11) != ((0 < iVar3 || lVar6 != 0) || uVar19 == uVar11))) &&
     (bVar13 = true, 0 < iVar3)) {
LAB_00338da0:
    if (((uVar19 == uVar11) || ((lVar6 == 0 && iVar3 < 1) && uVar19 != uVar11)) ||
       (bVar24 = true, 0 < iVar3)) {
      puVar21 = (undefined1 *)((InnerProductLayerParams *)puVar18)->bias_;
      goto LAB_00338dcc;
    }
  }
  else {
    puVar21 = (undefined1 *)((InnerProductLayerParams *)puVar18)->bias_;
    puVar22 = puVar21;
    if ((WeightParams *)puVar21 == (WeightParams *)0x0) {
      puVar22 = Specification::_WeightParams_default_instance_;
    }
    iVar4 = (((WeightParams *)puVar22)->floatvalue_).current_size_;
    lVar7 = *(long *)(((ulong)(((WeightParams *)puVar22)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar23 = (0 < iVar4) + 1;
    if (lVar7 == 0) {
      uVar23 = (uint)(0 < iVar4);
    }
    uVar12 = (uint)(*(long *)(((ulong)(((WeightParams *)puVar22)->int8rawvalue_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe) + 8) == 0);
    uVar23 = (uVar23 - (*(long *)(((ulong)(((WeightParams *)puVar22)->rawvalue_).tagged_ptr_.ptr_ &
                                  0xfffffffffffffffe) + 8) == 0)) + 2;
    if (((1 < uVar23 - uVar12) ||
        ((uVar23 == uVar12) == ((0 < iVar4 || lVar7 != 0) || uVar23 == uVar12))) ||
       (bVar13 = true, iVar4 < 1)) {
      puVar22 = (undefined1 *)((BatchnormLayerParams *)puVar18)->mean_;
      if ((WeightParams *)puVar22 == (WeightParams *)0x0) {
        puVar22 = Specification::_WeightParams_default_instance_;
      }
      iVar4 = (((WeightParams *)puVar22)->floatvalue_).current_size_;
      lVar7 = *(long *)(((ulong)(((WeightParams *)puVar22)->float16value_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar23 = (0 < iVar4) + 1;
      if (lVar7 == 0) {
        uVar23 = (uint)(0 < iVar4);
      }
      uVar12 = (uint)(*(long *)(((ulong)(((WeightParams *)puVar22)->int8rawvalue_).tagged_ptr_.ptr_
                                & 0xfffffffffffffffe) + 8) == 0);
      uVar23 = (uVar23 - (*(long *)(((ulong)(((WeightParams *)puVar22)->rawvalue_).tagged_ptr_.ptr_
                                    & 0xfffffffffffffffe) + 8) == 0)) + 2;
      if (((1 < uVar23 - uVar12) ||
          ((uVar23 == uVar12) == ((0 < iVar4 || lVar7 != 0) || uVar23 == uVar12))) ||
         (bVar13 = true, iVar4 < 1)) {
        puVar22 = (undefined1 *)((BatchnormLayerParams *)puVar18)->variance_;
        if ((WeightParams *)puVar22 == (WeightParams *)0x0) {
          puVar22 = Specification::_WeightParams_default_instance_;
        }
        iVar4 = (((WeightParams *)puVar22)->floatvalue_).current_size_;
        lVar7 = *(long *)(((ulong)(((WeightParams *)puVar22)->float16value_).tagged_ptr_.ptr_ &
                          0xfffffffffffffffe) + 8);
        uVar23 = (0 < iVar4) + 1;
        if (lVar7 == 0) {
          uVar23 = (uint)(0 < iVar4);
        }
        uVar12 = (uint)(*(long *)(((ulong)(((WeightParams *)puVar22)->int8rawvalue_).tagged_ptr_.
                                          ptr_ & 0xfffffffffffffffe) + 8) == 0);
        uVar23 = (uVar23 - (*(long *)(((ulong)(((WeightParams *)puVar22)->rawvalue_).tagged_ptr_.
                                              ptr_ & 0xfffffffffffffffe) + 8) == 0)) + 2;
        if (uVar23 - uVar12 < 2) {
          bVar13 = ((lVar7 != 0 || 0 < iVar4) || uVar23 == uVar12) != (uVar23 == uVar12) &&
                   0 < iVar4;
        }
        else {
          bVar13 = false;
        }
      }
    }
    if (uVar19 - uVar11 < 2) goto LAB_00338da0;
LAB_00338dcc:
    if ((WeightParams *)puVar21 == (WeightParams *)0x0) {
      puVar21 = Specification::_WeightParams_default_instance_;
    }
    iVar3 = (((WeightParams *)puVar21)->floatvalue_).current_size_;
    lVar6 = *(long *)(((ulong)(((WeightParams *)puVar21)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar19 = (0 < iVar3) + 1;
    if (lVar6 == 0) {
      uVar19 = (uint)(0 < iVar3);
    }
    uVar11 = (uint)(*(long *)(((ulong)(((WeightParams *)puVar21)->int8rawvalue_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe) + 8) == 0);
    uVar19 = (uVar19 - (*(long *)(((ulong)(((WeightParams *)puVar21)->rawvalue_).tagged_ptr_.ptr_ &
                                  0xfffffffffffffffe) + 8) == 0)) + 2;
    if (uVar19 - uVar11 < 2) {
      if (((uVar19 != uVar11) && ((lVar6 != 0 || 0 < iVar3) || uVar19 == uVar11)) &&
         (bVar24 = true, iVar3 < 1)) goto LAB_00338f06;
    }
    puVar21 = (undefined1 *)((BatchnormLayerParams *)puVar18)->mean_;
    if ((WeightParams *)puVar21 == (WeightParams *)0x0) {
      puVar21 = Specification::_WeightParams_default_instance_;
    }
    iVar3 = (((WeightParams *)puVar21)->floatvalue_).current_size_;
    lVar6 = *(long *)(((ulong)(((WeightParams *)puVar21)->float16value_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8);
    uVar19 = (0 < iVar3) + 1;
    if (lVar6 == 0) {
      uVar19 = (uint)(0 < iVar3);
    }
    uVar11 = (uint)(*(long *)(((ulong)(((WeightParams *)puVar21)->int8rawvalue_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe) + 8) == 0);
    uVar19 = (uVar19 - (*(long *)(((ulong)(((WeightParams *)puVar21)->rawvalue_).tagged_ptr_.ptr_ &
                                  0xfffffffffffffffe) + 8) == 0)) + 2;
    if (uVar19 - uVar11 < 2) {
      if (((uVar19 != uVar11) && ((lVar6 != 0 || 0 < iVar3) || uVar19 == uVar11)) &&
         (bVar24 = true, iVar3 < 1)) goto LAB_00338f06;
    }
    puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar18)->variance_;
    if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
      puVar20 = Specification::_WeightParams_default_instance_;
    }
    WVar14 = valueType((WeightParams *)puVar20);
    bVar24 = WVar14 == FLOAT16;
    uVar16 = layer->_oneof_case_[0];
    puVar20 = *(undefined1 **)&layer->layer_;
  }
LAB_00338f06:
  if (uVar16 != 0xa0) {
    puVar20 = Specification::_BatchnormLayerParams_default_instance_;
  }
  puVar18 = (undefined1 *)(((ActivationParams *)puVar20)->NonlinearityType_).linear_;
  if ((ActivationLinear *)puVar18 == (ActivationLinear *)0x0) {
    puVar18 = Specification::_WeightParams_default_instance_;
  }
  bVar10 = 0 < (int)((ActivationLinear *)puVar18)->alpha_;
  uVar19 = bVar10 + 1;
  if (*(long *)(((ulong)(((ActivationLinear *)((long)puVar18 + 0x20))->super_MessageLite).
                        _vptr_MessageLite & 0xfffffffffffffffe) + 8) == 0) {
    uVar19 = (uint)bVar10;
  }
  uVar8._0_4_ = ((ActivationLinear *)((long)puVar18 + 0x20))->alpha_;
  uVar8._4_4_ = ((ActivationLinear *)((long)puVar18 + 0x20))->beta_;
  if (((uVar19 - (*(long *)(((((ActivationLinear *)((long)puVar18 + 0x20))->super_MessageLite).
                             _internal_metadata_.ptr_ & 0xfffffffffffffffeU) + 8) == 0)) + 2) -
      (uint)(*(long *)((uVar8 & 0xfffffffffffffffe) + 8) == 0) < 2) {
    puVar18 = (undefined1 *)((InnerProductLayerParams *)puVar20)->bias_;
    if ((WeightParams *)puVar18 == (WeightParams *)0x0) {
      puVar18 = Specification::_WeightParams_default_instance_;
    }
    bVar10 = 0 < (((WeightParams *)puVar18)->floatvalue_).current_size_;
    uVar19 = bVar10 + 1;
    if (*(long *)(((ulong)(((WeightParams *)puVar18)->float16value_).tagged_ptr_.ptr_ &
                  0xfffffffffffffffe) + 8) == 0) {
      uVar19 = (uint)bVar10;
    }
    if (((uVar19 - (*(long *)(((ulong)(((WeightParams *)puVar18)->rawvalue_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe) + 8) == 0)) + 2) -
        (uint)(*(long *)(((ulong)(((WeightParams *)puVar18)->int8rawvalue_).tagged_ptr_.ptr_ &
                         0xfffffffffffffffe) + 8) == 0) < 2) {
      puVar18 = (undefined1 *)((BatchnormLayerParams *)puVar20)->mean_;
      if ((WeightParams *)puVar18 == (WeightParams *)0x0) {
        puVar18 = Specification::_WeightParams_default_instance_;
      }
      bVar10 = 0 < (((WeightParams *)puVar18)->floatvalue_).current_size_;
      uVar19 = bVar10 + 1;
      if (*(long *)(((ulong)(((WeightParams *)puVar18)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8) == 0) {
        uVar19 = (uint)bVar10;
      }
      if (((uVar19 - (*(long *)(((ulong)(((WeightParams *)puVar18)->rawvalue_).tagged_ptr_.ptr_ &
                                0xfffffffffffffffe) + 8) == 0)) + 2) -
          (uint)(*(long *)(((ulong)(((WeightParams *)puVar18)->int8rawvalue_).tagged_ptr_.ptr_ &
                           0xfffffffffffffffe) + 8) == 0) < 2) {
        puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->variance_;
        if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
          puVar20 = Specification::_WeightParams_default_instance_;
        }
        WVar14 = valueType((WeightParams *)puVar20);
        if ((!(bool)(bVar13 & bVar24)) && (WVar14 != UNSPECIFIED)) {
          if (layer->_oneof_case_[0] == 0xa0) {
            puVar20 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar20 = Specification::_BatchnormLayerParams_default_instance_;
          }
          puVar18 = (undefined1 *)(((ActivationParams *)puVar20)->NonlinearityType_).linear_;
          if ((WeightParams *)puVar18 == (WeightParams *)0x0) {
            puVar18 = Specification::_WeightParams_default_instance_;
          }
          local_58 = ((BatchnormLayerParams *)puVar20)->channels_;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
          pvVar9 = (layer->name_).tagged_ptr_.ptr_;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"gamma","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar18,local_58,1,&local_98,
                     (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          bVar13 = Result::good(__return_storage_ptr__);
          if (!bVar13) {
            return __return_storage_ptr__;
          }
          pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != paVar1) {
            operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
          }
          if (layer->_oneof_case_[0] == 0xa0) {
            puVar20 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar20 = Specification::_BatchnormLayerParams_default_instance_;
          }
          puVar20 = (undefined1 *)((InnerProductLayerParams *)puVar20)->bias_;
          if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
            puVar20 = Specification::_WeightParams_default_instance_;
          }
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
          pvVar9 = (layer->name_).tagged_ptr_.ptr_;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"beta","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar20,local_58,1,&local_98,
                     (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_78);
          paVar2 = &local_98.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          bVar13 = Result::good(__return_storage_ptr__);
          if (!bVar13) {
            return __return_storage_ptr__;
          }
          pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != paVar1) {
            operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
          }
          if (layer->_oneof_case_[0] == 0xa0) {
            puVar20 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar20 = Specification::_BatchnormLayerParams_default_instance_;
          }
          if (((BatchnormLayerParams *)puVar20)->computemeanvar_ != false) {
LAB_00339313:
            Result::Result(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->mean_;
          if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
            puVar20 = Specification::_WeightParams_default_instance_;
          }
          WVar14 = valueType((WeightParams *)puVar20);
          if (WVar14 != EMPTY) {
            if (layer->_oneof_case_[0] == 0xa0) {
              puVar20 = *(undefined1 **)&layer->layer_;
            }
            else {
              puVar20 = Specification::_BatchnormLayerParams_default_instance_;
            }
            puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->mean_;
            if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
              puVar20 = Specification::_WeightParams_default_instance_;
            }
            WVar14 = valueType((WeightParams *)puVar20);
            if (WVar14 != EMPTY) {
              if (layer->_oneof_case_[0] == 0xa0) {
                puVar20 = *(undefined1 **)&layer->layer_;
              }
              else {
                puVar20 = Specification::_BatchnormLayerParams_default_instance_;
              }
              puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->mean_;
              if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
                puVar20 = Specification::_WeightParams_default_instance_;
              }
              local_98._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
              pvVar9 = (layer->name_).tagged_ptr_.ptr_;
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mean","");
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar20,local_58,1,&local_98,
                         (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_78);
              paVar2 = &local_98.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != paVar2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              bVar13 = Result::good(__return_storage_ptr__);
              if (!bVar13) {
                return __return_storage_ptr__;
              }
              pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar5 != paVar1) {
                operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
              }
              if (layer->_oneof_case_[0] == 0xa0) {
                puVar20 = *(undefined1 **)&layer->layer_;
              }
              else {
                puVar20 = Specification::_BatchnormLayerParams_default_instance_;
              }
              puVar20 = (undefined1 *)((BatchnormLayerParams *)puVar20)->variance_;
              if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
                puVar20 = Specification::_WeightParams_default_instance_;
              }
              local_98._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
              pvVar9 = (layer->name_).tagged_ptr_.ptr_;
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"variance","");
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar20,local_58,1,&local_98,
                         (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != paVar2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              bVar13 = Result::good(__return_storage_ptr__);
              if (!bVar13) {
                return __return_storage_ptr__;
              }
              pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar5 != paVar1) {
                operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
              }
              goto LAB_00339313;
            }
          }
          std::operator+(&local_78,"Batchnorm layer \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_78);
          psVar17 = (size_type *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_98.field_2._M_allocated_capacity = *psVar17;
            local_98.field_2._8_8_ = plVar15[3];
            local_98._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar17;
            local_98._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_98._M_string_length = plVar15[1];
          *plVar15 = (long)psVar17;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_98);
          goto LAB_003390ae;
        }
      }
    }
  }
  std::operator+(&local_78,"Batchnorm layer \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  psVar17 = (size_type *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_98.field_2._M_allocated_capacity = *psVar17;
    local_98.field_2._8_8_ = plVar15[3];
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar17;
    local_98._M_dataplus._M_p = (pointer)*plVar15;
  }
  local_98._M_string_length = plVar15[1];
  *plVar15 = (long)psVar17;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_98);
LAB_003390ae:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank));
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta"));

    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance"));
    }
    return Result();
}